

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>
CreateChainParams(ArgsManager *args,ChainType chain)

{
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  SigNetOptions opts;
  __node_base_ptr p_Stack_20;
  bool local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      CChainParams::Main();
      return (unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>)args;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      CChainParams::TestNet();
      return (unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>)args;
    }
    break;
  case 2:
    opts.challenge.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _24_8_ = opts.challenge.
             super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._24_8_ & 0xffffffffffffff00;
    opts.seeds.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._24_8_ = opts.seeds.
              super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    ReadSigNetArgs((ArgsManager *)CONCAT44(in_register_00000034,chain),&opts);
    CChainParams::SigNet((SigNetOptions *)args);
    CChainParams::SigNetOptions::~SigNetOptions(&opts);
    goto LAB_00a53469;
  case 3:
    opts.challenge.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&opts.seeds.
                          super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_payload + 0x10);
    opts.challenge.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = &DAT_00000001;
    opts.challenge.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    opts.challenge.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = false;
    opts.challenge.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _25_7_ = 0;
    opts.seeds.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
    opts.seeds.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._24_8_ = &p_Stack_20;
    opts.seeds.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opts.seeds.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Stack_20 = (__node_base_ptr)0x0;
    local_18 = false;
    ReadRegTestArgs((ArgsManager *)CONCAT44(in_register_00000034,chain),(RegTestOptions *)&opts);
    CChainParams::RegTest((RegTestOptions *)args);
    CChainParams::RegTestOptions::~RegTestOptions((RegTestOptions *)&opts);
LAB_00a53469:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return (__uniq_ptr_data<const_CChainParams,_std::default_delete<const_CChainParams>,_true,_true>
              )(__uniq_ptr_data<const_CChainParams,_std::default_delete<const_CChainParams>,_true,_true>
                )args;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      CChainParams::TestNet4();
      return (unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>)args;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparams.cpp"
                  ,0x83,
                  "std::unique_ptr<const CChainParams> CreateChainParams(const ArgsManager &, const ChainType)"
                 );
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<const CChainParams> CreateChainParams(const ArgsManager& args, const ChainType chain)
{
    switch (chain) {
    case ChainType::MAIN:
        return CChainParams::Main();
    case ChainType::TESTNET:
        return CChainParams::TestNet();
    case ChainType::TESTNET4:
        return CChainParams::TestNet4();
    case ChainType::SIGNET: {
        auto opts = CChainParams::SigNetOptions{};
        ReadSigNetArgs(args, opts);
        return CChainParams::SigNet(opts);
    }
    case ChainType::REGTEST: {
        auto opts = CChainParams::RegTestOptions{};
        ReadRegTestArgs(args, opts);
        return CChainParams::RegTest(opts);
    }
    }
    assert(false);
}